

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O0

SinkFinalizeType __thiscall
duckdb::PhysicalHashAggregate::FinalizeDistinct
          (PhysicalHashAggregate *this,Pipeline *pipeline,Event *event,ClientContext *context,
          GlobalSinkState *gstate_p)

{
  bool bVar1;
  size_type sVar2;
  type pDVar3;
  type this_00;
  ClientContext *pCVar4;
  GlobalSinkState *gstate_p_00;
  shared_ptr<duckdb::Event,_true> *in_RDX;
  long in_RDI;
  shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_true> new_event;
  GlobalSinkState *radix_state;
  value_type *radix_table;
  idx_t table_idx;
  DistinctAggregateState *distinct_state;
  DistinctAggregateData *distinct_data;
  value_type *grouping;
  idx_t i;
  HashAggregateGlobalSinkState *gstate;
  size_type in_stack_ffffffffffffff38;
  shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_true> *ref;
  GlobalSinkState *in_stack_ffffffffffffff40;
  HashAggregateGlobalSinkState *in_stack_ffffffffffffff70;
  PhysicalHashAggregate *in_stack_ffffffffffffff78;
  Pipeline *in_stack_ffffffffffffff80;
  ClientContext *in_stack_ffffffffffffff88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff90;
  ClientContext *pCVar5;
  ClientContext *context_00;
  ulong local_38;
  
  GlobalSinkState::Cast<duckdb::HashAggregateGlobalSinkState>(in_stack_ffffffffffffff40);
  for (local_38 = 0;
      sVar2 = ::std::
              vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
              ::size((vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                      *)(in_RDI + 0x148)), local_38 < sVar2; local_38 = local_38 + 1) {
    vector<duckdb::HashAggregateGroupingData,_true>::operator[]
              ((vector<duckdb::HashAggregateGroupingData,_true> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    pDVar3 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
             ::operator*((unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                          *)in_stack_ffffffffffffff40);
    vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
              ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    this_00 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
              ::operator*((unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
                           *)in_stack_ffffffffffffff40);
    pCVar5 = (ClientContext *)0x0;
    while (context_00 = pCVar5,
          pCVar4 = (ClientContext *)
                   ::std::
                   vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                   ::size(&(pDVar3->radix_tables).
                           super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                         ), pCVar5 < pCVar4) {
      vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                    *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
                          *)0x1713863);
      if (bVar1) {
        gstate_p_00 = (GlobalSinkState *)
                      vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                                    *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                      *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
        operator*((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                   *)in_stack_ffffffffffffff40);
        unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
        ::operator->((unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                      *)in_stack_ffffffffffffff40);
        RadixPartitionedHashTable::Finalize
                  ((RadixPartitionedHashTable *)this_00,context_00,gstate_p_00);
      }
      pCVar5 = (ClientContext *)
               ((long)&(context_00->super_enable_shared_from_this<duckdb::ClientContext>).
                       __weak_this_.internal.
                       super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               1);
    }
  }
  ref = (shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_true> *)&stack0xffffffffffffff88;
  make_shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,duckdb::ClientContext&,duckdb::Pipeline&,duckdb::PhysicalHashAggregate_const&,duckdb::HashAggregateGlobalSinkState&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
  shared_ptr<duckdb::Event,_true>::shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_0>
            (in_RDX,ref);
  Event::InsertEvent((Event *)in_stack_ffffffffffffff90._M_pi,
                     (shared_ptr<duckdb::Event,_true> *)in_stack_ffffffffffffff88);
  shared_ptr<duckdb::Event,_true>::~shared_ptr((shared_ptr<duckdb::Event,_true> *)0x1713957);
  shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_true>::~shared_ptr
            ((shared_ptr<duckdb::HashAggregateDistinctFinalizeEvent,_true> *)0x1713961);
  return READY;
}

Assistant:

SinkFinalizeType PhysicalHashAggregate::FinalizeDistinct(Pipeline &pipeline, Event &event, ClientContext &context,
                                                         GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<HashAggregateGlobalSinkState>();
	D_ASSERT(distinct_collection_info);

	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping = groupings[i];
		auto &distinct_data = *grouping.distinct_data;
		auto &distinct_state = *gstate.grouping_states[i].distinct_state;

		for (idx_t table_idx = 0; table_idx < distinct_data.radix_tables.size(); table_idx++) {
			if (!distinct_data.radix_tables[table_idx]) {
				continue;
			}
			auto &radix_table = distinct_data.radix_tables[table_idx];
			auto &radix_state = *distinct_state.radix_states[table_idx];
			radix_table->Finalize(context, radix_state);
		}
	}
	auto new_event = make_shared_ptr<HashAggregateDistinctFinalizeEvent>(context, pipeline, *this, gstate);
	event.InsertEvent(std::move(new_event));
	return SinkFinalizeType::READY;
}